

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecialRuntimeObjects.cpp
# Opt level: O2

void __thiscall
Lodtalk::SpecialRuntimeObjects::createSpecialObjectTable(SpecialRuntimeObjects *this)

{
  uint __line;
  size_t sVar1;
  size_t sVar2;
  char *__assertion;
  anon_union_8_4_0eb573b0_for_Oop_0 local_20;
  WithoutGC wgc;
  
  wgc.context = this->context;
  VMContext::disableGC(wgc.context);
  local_20.pointer = (uint8_t *)&NilObject;
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::push_back
            (&this->specialObjectTable,(value_type *)&local_20);
  local_20.pointer = (uint8_t *)&TrueObject;
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::push_back
            (&this->specialObjectTable,(value_type *)&local_20);
  local_20.pointer = (uint8_t *)&FalseObject;
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::push_back
            (&this->specialObjectTable,(value_type *)&local_20);
  this->blockActivationSelectorFirst =
       (long)(this->specialObjectTable).
             super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(this->specialObjectTable).
             super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>._M_impl.
             super__Vector_impl_data._M_start >> 3;
  local_20 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"value");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::emplace_back<Lodtalk::Oop>
            (&this->specialObjectTable,(Oop *)&local_20);
  local_20 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"value:");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::emplace_back<Lodtalk::Oop>
            (&this->specialObjectTable,(Oop *)&local_20);
  local_20 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"value:value:");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::emplace_back<Lodtalk::Oop>
            (&this->specialObjectTable,(Oop *)&local_20);
  local_20 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"value:value:value:");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::emplace_back<Lodtalk::Oop>
            (&this->specialObjectTable,(Oop *)&local_20);
  local_20 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"value:value:value:value:");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::emplace_back<Lodtalk::Oop>
            (&this->specialObjectTable,(Oop *)&local_20);
  local_20 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"value:value:value:value:value:");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::emplace_back<Lodtalk::Oop>
            (&this->specialObjectTable,(Oop *)&local_20);
  local_20 = (anon_union_8_4_0eb573b0_for_Oop_0)
             makeSelector(this,"value:value:value:value:value:value:");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::emplace_back<Lodtalk::Oop>
            (&this->specialObjectTable,(Oop *)&local_20);
  sVar1 = (long)(this->specialObjectTable).
                super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->specialObjectTable).
                super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  this->blockActivationSelectorCount = sVar1 - this->blockActivationSelectorFirst;
  this->specialMessageSelectorFirst = sVar1;
  local_20 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"+");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::emplace_back<Lodtalk::Oop>
            (&this->specialObjectTable,(Oop *)&local_20);
  local_20 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"-");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::emplace_back<Lodtalk::Oop>
            (&this->specialObjectTable,(Oop *)&local_20);
  local_20 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"<");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::emplace_back<Lodtalk::Oop>
            (&this->specialObjectTable,(Oop *)&local_20);
  local_20 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,">");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::emplace_back<Lodtalk::Oop>
            (&this->specialObjectTable,(Oop *)&local_20);
  local_20 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"<=");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::emplace_back<Lodtalk::Oop>
            (&this->specialObjectTable,(Oop *)&local_20);
  local_20 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,">=");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::emplace_back<Lodtalk::Oop>
            (&this->specialObjectTable,(Oop *)&local_20);
  local_20 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"=");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::emplace_back<Lodtalk::Oop>
            (&this->specialObjectTable,(Oop *)&local_20);
  local_20 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"~=");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::emplace_back<Lodtalk::Oop>
            (&this->specialObjectTable,(Oop *)&local_20);
  local_20 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"*");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::emplace_back<Lodtalk::Oop>
            (&this->specialObjectTable,(Oop *)&local_20);
  local_20 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"/");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::emplace_back<Lodtalk::Oop>
            (&this->specialObjectTable,(Oop *)&local_20);
  local_20 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"\\\\");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::emplace_back<Lodtalk::Oop>
            (&this->specialObjectTable,(Oop *)&local_20);
  local_20 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"@");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::emplace_back<Lodtalk::Oop>
            (&this->specialObjectTable,(Oop *)&local_20);
  local_20 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"bitShift:");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::emplace_back<Lodtalk::Oop>
            (&this->specialObjectTable,(Oop *)&local_20);
  local_20 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"//");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::emplace_back<Lodtalk::Oop>
            (&this->specialObjectTable,(Oop *)&local_20);
  local_20 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"bitAnd:");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::emplace_back<Lodtalk::Oop>
            (&this->specialObjectTable,(Oop *)&local_20);
  local_20 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"bitOr:");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::emplace_back<Lodtalk::Oop>
            (&this->specialObjectTable,(Oop *)&local_20);
  local_20 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"at:");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::emplace_back<Lodtalk::Oop>
            (&this->specialObjectTable,(Oop *)&local_20);
  local_20 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"at:put:");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::emplace_back<Lodtalk::Oop>
            (&this->specialObjectTable,(Oop *)&local_20);
  local_20 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"size");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::emplace_back<Lodtalk::Oop>
            (&this->specialObjectTable,(Oop *)&local_20);
  local_20 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"next");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::emplace_back<Lodtalk::Oop>
            (&this->specialObjectTable,(Oop *)&local_20);
  local_20 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"nextPut:");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::emplace_back<Lodtalk::Oop>
            (&this->specialObjectTable,(Oop *)&local_20);
  local_20 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"atEnd");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::emplace_back<Lodtalk::Oop>
            (&this->specialObjectTable,(Oop *)&local_20);
  local_20 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"==");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::emplace_back<Lodtalk::Oop>
            (&this->specialObjectTable,(Oop *)&local_20);
  local_20 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"class");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::emplace_back<Lodtalk::Oop>
            (&this->specialObjectTable,(Oop *)&local_20);
  local_20.pointer = (uint8_t *)&NilObject;
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::emplace_back<Lodtalk::Oop>
            (&this->specialObjectTable,(Oop *)&local_20);
  local_20 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"value");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::emplace_back<Lodtalk::Oop>
            (&this->specialObjectTable,(Oop *)&local_20);
  local_20 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"value:");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::emplace_back<Lodtalk::Oop>
            (&this->specialObjectTable,(Oop *)&local_20);
  local_20 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"do:");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::emplace_back<Lodtalk::Oop>
            (&this->specialObjectTable,(Oop *)&local_20);
  local_20 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"new");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::emplace_back<Lodtalk::Oop>
            (&this->specialObjectTable,(Oop *)&local_20);
  local_20 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"new:");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::emplace_back<Lodtalk::Oop>
            (&this->specialObjectTable,(Oop *)&local_20);
  local_20 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"x");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::emplace_back<Lodtalk::Oop>
            (&this->specialObjectTable,(Oop *)&local_20);
  local_20 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"y");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::emplace_back<Lodtalk::Oop>
            (&this->specialObjectTable,(Oop *)&local_20);
  local_20 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"basicNew");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::emplace_back<Lodtalk::Oop>
            (&this->specialObjectTable,(Oop *)&local_20);
  local_20 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"basicNew:");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::emplace_back<Lodtalk::Oop>
            (&this->specialObjectTable,(Oop *)&local_20);
  local_20 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"doesNotUnderstand:");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::emplace_back<Lodtalk::Oop>
            (&this->specialObjectTable,(Oop *)&local_20);
  local_20 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"nativeMethodFailed:");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::emplace_back<Lodtalk::Oop>
            (&this->specialObjectTable,(Oop *)&local_20);
  sVar1 = (long)(this->specialObjectTable).
                super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->specialObjectTable).
                super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  sVar2 = sVar1 - this->specialMessageSelectorFirst;
  this->specialMessageSelectorCount = sVar2;
  if (sVar2 == 0x24) {
    this->compilerMessageSelectorFirst = sVar1;
    local_20 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"ifTrue:");
    std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::emplace_back<Lodtalk::Oop>
              (&this->specialObjectTable,(Oop *)&local_20);
    local_20 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"ifFalse:");
    std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::emplace_back<Lodtalk::Oop>
              (&this->specialObjectTable,(Oop *)&local_20);
    local_20 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"ifTrue:ifFalse:");
    std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::emplace_back<Lodtalk::Oop>
              (&this->specialObjectTable,(Oop *)&local_20);
    local_20 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"ifFalse:ifTrue:");
    std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::emplace_back<Lodtalk::Oop>
              (&this->specialObjectTable,(Oop *)&local_20);
    local_20 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"ifNil:");
    std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::emplace_back<Lodtalk::Oop>
              (&this->specialObjectTable,(Oop *)&local_20);
    local_20 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"ifNotNil:");
    std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::emplace_back<Lodtalk::Oop>
              (&this->specialObjectTable,(Oop *)&local_20);
    local_20 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"ifNil:ifNotNil:");
    std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::emplace_back<Lodtalk::Oop>
              (&this->specialObjectTable,(Oop *)&local_20);
    local_20 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"ifNotNil:ifNil:");
    std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::emplace_back<Lodtalk::Oop>
              (&this->specialObjectTable,(Oop *)&local_20);
    local_20 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"whileTrue:");
    std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::emplace_back<Lodtalk::Oop>
              (&this->specialObjectTable,(Oop *)&local_20);
    local_20 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"whileFalse:");
    std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::emplace_back<Lodtalk::Oop>
              (&this->specialObjectTable,(Oop *)&local_20);
    local_20 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"repeat");
    std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::emplace_back<Lodtalk::Oop>
              (&this->specialObjectTable,(Oop *)&local_20);
    local_20 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"doWhileTrue:");
    std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::emplace_back<Lodtalk::Oop>
              (&this->specialObjectTable,(Oop *)&local_20);
    local_20 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"doWhileFalse:");
    std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::emplace_back<Lodtalk::Oop>
              (&this->specialObjectTable,(Oop *)&local_20);
    local_20 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"to:by:do:");
    std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::emplace_back<Lodtalk::Oop>
              (&this->specialObjectTable,(Oop *)&local_20);
    local_20 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"to:do:");
    std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::emplace_back<Lodtalk::Oop>
              (&this->specialObjectTable,(Oop *)&local_20);
    sVar1 = ((long)(this->specialObjectTable).
                   super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->specialObjectTable).
                   super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3) - this->compilerMessageSelectorFirst;
    this->compilerMessageSelectorCount = sVar1;
    if (sVar1 == 0xf) {
      WithoutGC::~WithoutGC(&wgc);
      return;
    }
    __assertion = 
    "compilerMessageSelectorCount == (size_t)CompilerOptimizedSelector::CompilerMessageCount";
    __line = 0x7b;
  }
  else {
    __assertion = 
    "specialMessageSelectorCount == (size_t)SpecialMessageSelector::SpecialMessageCount";
    __line = 99;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/vm/SpecialRuntimeObjects.cpp"
                ,__line,"void Lodtalk::SpecialRuntimeObjects::createSpecialObjectTable()");
}

Assistant:

void SpecialRuntimeObjects::createSpecialObjectTable()
{
    WithoutGC wgc(context);

	specialObjectTable.push_back(nilOop());
	specialObjectTable.push_back(trueOop());
	specialObjectTable.push_back(falseOop());

    // Block activation selectors
    blockActivationSelectorFirst = specialObjectTable.size();
    specialObjectTable.push_back(makeSelector("value"));
    specialObjectTable.push_back(makeSelector("value:"));
    specialObjectTable.push_back(makeSelector("value:value:"));
    specialObjectTable.push_back(makeSelector("value:value:value:"));
    specialObjectTable.push_back(makeSelector("value:value:value:value:"));
    specialObjectTable.push_back(makeSelector("value:value:value:value:value:"));
    specialObjectTable.push_back(makeSelector("value:value:value:value:value:value:"));
    blockActivationSelectorCount = specialObjectTable.size() - blockActivationSelectorFirst;

    // Special message selectors
    specialMessageSelectorFirst = specialObjectTable.size();

    // Arithmetic messages
    specialObjectTable.push_back(makeSelector("+"));
    specialObjectTable.push_back(makeSelector("-"));
    specialObjectTable.push_back(makeSelector("<"));
    specialObjectTable.push_back(makeSelector(">"));
    specialObjectTable.push_back(makeSelector("<="));
    specialObjectTable.push_back(makeSelector(">="));
    specialObjectTable.push_back(makeSelector("="));
    specialObjectTable.push_back(makeSelector("~="));
    specialObjectTable.push_back(makeSelector("*"));
    specialObjectTable.push_back(makeSelector("/"));
    specialObjectTable.push_back(makeSelector("\\\\"));
    specialObjectTable.push_back(makeSelector("@"));
    specialObjectTable.push_back(makeSelector("bitShift:"));
    specialObjectTable.push_back(makeSelector("//"));
    specialObjectTable.push_back(makeSelector("bitAnd:"));
    specialObjectTable.push_back(makeSelector("bitOr:"));

    // Object accessing messages.
    specialObjectTable.push_back(makeSelector("at:"));
    specialObjectTable.push_back(makeSelector("at:put:"));
    specialObjectTable.push_back(makeSelector("size"));
    specialObjectTable.push_back(makeSelector("next"));
    specialObjectTable.push_back(makeSelector("nextPut:"));
    specialObjectTable.push_back(makeSelector("atEnd"));
    specialObjectTable.push_back(makeSelector("=="));
    specialObjectTable.push_back(makeSelector("class"));

    specialObjectTable.push_back(Oop()); // Unassigned

    // Block evaluation.
    specialObjectTable.push_back(makeSelector("value"));
    specialObjectTable.push_back(makeSelector("value:"));
    specialObjectTable.push_back(makeSelector("do:"));

    // Object instantiation.
    specialObjectTable.push_back(makeSelector("new"));
    specialObjectTable.push_back(makeSelector("new:"));
    specialObjectTable.push_back(makeSelector("x"));
    specialObjectTable.push_back(makeSelector("y"));
    specialObjectTable.push_back(makeSelector("basicNew"));
    specialObjectTable.push_back(makeSelector("basicNew:"));

    // Does not understand
    specialObjectTable.push_back(makeSelector("doesNotUnderstand:"));
    specialObjectTable.push_back(makeSelector("nativeMethodFailed:"));

    specialMessageSelectorCount = specialObjectTable.size() - specialMessageSelectorFirst;
    assert(specialMessageSelectorCount == (size_t)SpecialMessageSelector::SpecialMessageCount);

    compilerMessageSelectorFirst = specialObjectTable.size();
    specialObjectTable.push_back(makeSelector("ifTrue:"));
    specialObjectTable.push_back(makeSelector("ifFalse:"));
    specialObjectTable.push_back(makeSelector("ifTrue:ifFalse:"));
    specialObjectTable.push_back(makeSelector("ifFalse:ifTrue:"));
    specialObjectTable.push_back(makeSelector("ifNil:"));
    specialObjectTable.push_back(makeSelector("ifNotNil:"));
    specialObjectTable.push_back(makeSelector("ifNil:ifNotNil:"));
    specialObjectTable.push_back(makeSelector("ifNotNil:ifNil:"));

    // Loops
    specialObjectTable.push_back(makeSelector("whileTrue:"));
    specialObjectTable.push_back(makeSelector("whileFalse:"));
    specialObjectTable.push_back(makeSelector("repeat"));
    specialObjectTable.push_back(makeSelector("doWhileTrue:"));
    specialObjectTable.push_back(makeSelector("doWhileFalse:"));

    // Iteration
    specialObjectTable.push_back(makeSelector("to:by:do:"));
    specialObjectTable.push_back(makeSelector("to:do:"));

    compilerMessageSelectorCount = specialObjectTable.size() - compilerMessageSelectorFirst;
    assert(compilerMessageSelectorCount == (size_t)CompilerOptimizedSelector::CompilerMessageCount);
}